

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,google::protobuf::internal::InternalMetadataWithArenaLite>
          (ExtensionSet *this,char *ptr,MessageLite *containing_type,
          InternalMetadataWithArenaLite *metadata,ParseContext *ctx)

{
  byte bVar1;
  StringPiece flat;
  int iVar2;
  ParseContext *this_00;
  char *pcVar3;
  undefined4 extraout_var;
  uint uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  uint32 res;
  uint uVar7;
  uint uVar8;
  ParseContext *pPVar9;
  uint uVar10;
  ExtensionInfo *extension_00;
  byte *ptr_00;
  ushort *p;
  bool bVar11;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_int> pVar13;
  pair<const_char_*,_bool> pVar14;
  StringPiece val;
  bool was_packed_on_wire;
  string payload;
  ExtensionInfo extension;
  bool local_f1;
  string local_f0;
  char *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  ExtensionInfo local_c0;
  EpsCopyInputStream local_a0;
  int local_48;
  undefined4 local_44;
  DescriptorPool *local_40;
  MessageFactory *pMStack_38;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  this_00 = (ParseContext *)this;
LAB_002bdb4a:
  pPVar9 = (ParseContext *)0x0;
LAB_002bdb4c:
  while( true ) {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_002bde33;
      this_00 = ctx;
      pVar14 = EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar14.first;
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_002bde33;
    }
    p = (ushort *)((byte *)ptr + 1);
    bVar1 = *ptr;
    pVar12.second._0_1_ = bVar1;
    pVar12.first = (char *)p;
    pVar12._9_7_ = 0;
    if (bVar1 == 0x1a) break;
    if (bVar1 == 0x10) goto LAB_002bdbcd;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)(byte)*p * 0x80) - 0x80;
      if ((char)(byte)*p < '\0') {
        pVar12 = ReadTagFallback(ptr,res);
      }
      else {
        pVar12.second = res;
        pVar12.first = (char *)((byte *)ptr + 2);
        pVar12._12_4_ = 0;
      }
    }
    ptr = pVar12.first;
    uVar4 = pVar12.second;
    if ((uVar4 == 0) || ((uVar4 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar4 - 1;
      goto LAB_002bde33;
    }
    this_00 = (ParseContext *)this;
    ptr = ParseField(this,pVar12._8_8_ & 0xffffffff,ptr,containing_type,metadata,ctx);
LAB_002bdbc3:
    if ((byte *)ptr == (byte *)0x0) goto LAB_002bde26;
  }
  if ((int)pPVar9 != 0) {
    this_00 = (ParseContext *)this;
    ptr = ParseField(this,((ulong)pPVar9 & 0xffffffff) * 8 + 2,(char *)p,containing_type,metadata,
                     ctx);
LAB_002bdd59:
    pPVar9 = (ParseContext *)0x0;
    goto LAB_002bdbc3;
  }
  bVar1 = (byte)*p;
  uVar4 = (uint)bVar1;
  if (-1 < (char)bVar1) {
    ptr_00 = (byte *)ptr + 2;
LAB_002bdd49:
    this_00 = ctx;
    ptr = EpsCopyInputStream::ReadString
                    (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar4,&local_f0);
    goto LAB_002bdd59;
  }
  pVar13 = ReadSizeFallback((char *)p,(uint)bVar1);
  uVar4 = pVar13.second;
  ptr_00 = (byte *)pVar13.first;
  if (ptr_00 != (byte *)0x0) goto LAB_002bdd49;
  goto LAB_002bde26;
LAB_002bdbcd:
  uVar7 = (uint)(char)*p;
  uVar4 = *p + uVar7;
  uVar10 = uVar7 * 2 & uVar4;
  uVar8 = uVar10 >> 1;
  pPVar9 = (ParseContext *)(ulong)uVar8;
  if ((short)uVar10 < 0) {
    p = (ushort *)((byte *)ptr + 3);
    lVar5 = 0xd;
    this_00 = (ParseContext *)(ulong)uVar8;
    while( true ) {
      uVar7 = (uint)(char)*p;
      uVar4 = *p + uVar7;
      uVar8 = uVar7 * 2 & uVar4;
      pPVar9 = (ParseContext *)
               ((this_00->super_EpsCopyInputStream).buffer_ +
               ((ulong)uVar8 - 2 << ((byte)lVar5 & 0x3f)) + -0x28);
      if (-1 < (short)uVar8) break;
      lVar5 = lVar5 + 0xe;
      p = p + 1;
      ptr = (char *)0x0;
      this_00 = pPVar9;
      if (lVar5 == 0x45) goto LAB_002bde33;
    }
    bVar11 = uVar4 < uVar7;
  }
  else {
    bVar11 = uVar4 < uVar7;
  }
  ptr = (char *)((long)p + (ulong)bVar11 + 1);
  if ((char *)local_f0._M_string_length == (char *)0x0) goto LAB_002bdb4c;
  local_a0.limit_end_ = (char *)&PTR__ExtensionFinder_0066e9c0;
  iVar2 = (int)pPVar9;
  extension_00 = &local_c0;
  local_a0.buffer_end_ = (char *)containing_type;
  bVar11 = FindExtensionInfoFromFieldNumber
                     ((ExtensionSet *)this_00,2,iVar2,(ExtensionFinder *)&local_a0,extension_00,
                      &local_f1);
  if (bVar11) {
    if (local_c0.is_repeated == true) {
      this_00 = (ParseContext *)
                AddMessage(this,iVar2,'\v',(MessageLite *)local_c0.field_3.enum_validity_check.func,
                           local_c0.descriptor);
    }
    else {
      this_00 = (ParseContext *)
                MutableMessage(this,iVar2,'\v',
                               (MessageLite *)local_c0.field_3.enum_validity_check.func,
                               local_c0.descriptor);
    }
    local_48 = ctx->depth_;
    local_a0.buffer_[0x18] = '\0';
    local_a0.buffer_[0x19] = '\0';
    local_a0.buffer_[0x1a] = '\0';
    local_a0.buffer_[0x1b] = '\0';
    local_a0.buffer_[0x1c] = '\0';
    local_a0.buffer_[0x1d] = '\0';
    local_a0.buffer_[0x1e] = '\0';
    local_a0.buffer_[0x1f] = '\0';
    local_a0.aliasing_ = 0;
    local_a0.buffer_[8] = '\0';
    local_a0.buffer_[9] = '\0';
    local_a0.buffer_[10] = '\0';
    local_a0.buffer_[0xb] = '\0';
    local_a0.buffer_[0xc] = '\0';
    local_a0.buffer_[0xd] = '\0';
    local_a0.buffer_[0xe] = '\0';
    local_a0.buffer_[0xf] = '\0';
    local_a0.buffer_[0x10] = '\0';
    local_a0.buffer_[0x11] = '\0';
    local_a0.buffer_[0x12] = '\0';
    local_a0.buffer_[0x13] = '\0';
    local_a0.buffer_[0x14] = '\0';
    local_a0.buffer_[0x15] = '\0';
    local_a0.buffer_[0x16] = '\0';
    local_a0.buffer_[0x17] = '\0';
    local_a0.zcis_ = (ZeroCopyInputStream *)0x0;
    local_a0.buffer_[0] = '\0';
    local_a0.buffer_[1] = '\0';
    local_a0.buffer_[2] = '\0';
    local_a0.buffer_[3] = '\0';
    local_a0.buffer_[4] = '\0';
    local_a0.buffer_[5] = '\0';
    local_a0.buffer_[6] = '\0';
    local_a0.buffer_[7] = '\0';
    local_a0.last_tag_minus_1_ = 0;
    local_a0.overall_limit_ = 0x7fffffff;
    local_44 = 0x80000000;
    local_40 = (DescriptorPool *)0x0;
    pMStack_38 = (MessageFactory *)0x0;
    flat.length_ = local_f0._M_string_length;
    flat.ptr_ = local_f0._M_dataplus._M_p;
    pcVar3 = EpsCopyInputStream::InitFrom(&local_a0,flat);
    local_40 = (ctx->data_).pool;
    pMStack_38 = (ctx->data_).factory;
    iVar2 = (*((Arena *)(this_00->super_EpsCopyInputStream).limit_end_)->on_arena_destruction_)
                      (this_00,pcVar3,&local_a0);
    if ((CONCAT44(extraout_var,iVar2) == 0) ||
       (pPVar9 = (ParseContext *)0x0, local_a0.last_tag_minus_1_ != 0)) {
LAB_002bde26:
      ptr = (char *)0x0;
LAB_002bde33:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      return (char *)(byte *)ptr;
    }
    goto LAB_002bdb4c;
  }
  local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_f0._M_dataplus._M_p;
  local_d0 = (char *)local_f0._M_string_length;
  if ((*(ulong *)metadata & 1) == 0) {
    pbVar6 = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ::mutable_unknown_fields_slow
                       ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                         *)metadata);
  }
  else {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(ulong *)metadata & 0xfffffffffffffffe);
  }
  this_00 = (ParseContext *)((ulong)pPVar9 & 0xffffffff);
  val.length_ = (stringpiece_ssize_type)pbVar6;
  val.ptr_ = local_d0;
  WriteLengthDelimited((internal *)this_00,(uint32)local_c8,val,(string *)extension_00);
  goto LAB_002bdb4a;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(const char* ptr,
                                                  const Msg* containing_type,
                                                  Metadata* metadata,
                                                  internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}